

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnnvarset * copyvarset(rnnvarset *varset)

{
  rnnvarset *prVar1;
  int *piVar2;
  int local_1c;
  int i;
  rnnvarset *res;
  rnnvarset *varset_local;
  
  prVar1 = (rnnvarset *)calloc(0x10,1);
  prVar1->venum = varset->venum;
  piVar2 = (int *)calloc(4,(long)prVar1->venum->valsnum);
  prVar1->variants = piVar2;
  for (local_1c = 0; local_1c < prVar1->venum->valsnum; local_1c = local_1c + 1) {
    prVar1->variants[local_1c] = varset->variants[local_1c];
  }
  return prVar1;
}

Assistant:

static struct rnnvarset *copyvarset (struct rnnvarset *varset) {
	struct rnnvarset *res = calloc(sizeof *res, 1);
	res->venum = varset->venum;
	res->variants = calloc(sizeof *res->variants, res->venum->valsnum);
	int i;
	for (i = 0; i < res->venum->valsnum; i++)
		res->variants[i] = varset->variants[i];
	return res;
}